

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

void __thiscall icu_63::UnicodeString::UnicodeString(UnicodeString *this,UChar32 ch)

{
  bool bVar1;
  int16_t iVar2;
  
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_003e7ab8
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 2;
  if ((uint)ch < 0x10000) {
    (this->fUnion).fStackFields.fBuffer[0] = (char16_t)ch;
    bVar1 = true;
    iVar2 = 0x22;
  }
  else if ((uint)ch < 0x110000) {
    (this->fUnion).fStackFields.fBuffer[0] = (short)((uint)ch >> 10) + L'ퟀ';
    (this->fUnion).fStackFields.fBuffer[1] = (char16_t)ch & 0x3ffU | 0xdc00;
    bVar1 = true;
    iVar2 = 0x42;
  }
  else {
    iVar2 = 2;
    bVar1 = false;
  }
  if (bVar1) {
    (this->fUnion).fStackFields.fLengthAndFlags = iVar2;
  }
  return;
}

Assistant:

UnicodeString::UnicodeString(UChar32 ch) {
  fUnion.fFields.fLengthAndFlags = kShortString;
  int32_t i = 0;
  UBool isError = FALSE;
  U16_APPEND(fUnion.fStackFields.fBuffer, i, US_STACKBUF_SIZE, ch, isError);
  // We test isError so that the compiler does not complain that we don't.
  // If isError then i==0 which is what we want anyway.
  if(!isError) {
    setShortLength(i);
  }
}